

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O0

void move_window(lzma_mf *mf)

{
  uint uVar1;
  ulong __n;
  size_t move_size;
  uint32_t move_offset;
  lzma_mf *mf_local;
  
  if (mf->read_pos <= mf->keep_size_before) {
    __assert_fail("mf->read_pos > mf->keep_size_before",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                  ,0x34,"void move_window(lzma_mf *)");
  }
  uVar1 = mf->read_pos - mf->keep_size_before & 0xfffffff0;
  if (uVar1 < mf->write_pos) {
    __n = (ulong)(mf->write_pos - uVar1);
    if (uVar1 + __n <= (ulong)mf->size) {
      memmove(mf->buffer,mf->buffer + uVar1,__n);
      mf->offset = uVar1 + mf->offset;
      mf->read_pos = mf->read_pos - uVar1;
      mf->read_limit = mf->read_limit - uVar1;
      mf->write_pos = mf->write_pos - uVar1;
      return;
    }
    __assert_fail("move_offset + move_size <= mf->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                  ,0x3b,"void move_window(lzma_mf *)");
  }
  __assert_fail("mf->write_pos > move_offset",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmliblzma/liblzma/lz/lz_encoder.c"
                ,0x38,"void move_window(lzma_mf *)");
}

Assistant:

static void
move_window(lzma_mf *mf)
{
	// Align the move to a multiple of 16 bytes. Some LZ-based encoders
	// like LZMA use the lowest bits of mf->read_pos to know the
	// alignment of the uncompressed data. We also get better speed
	// for memmove() with aligned buffers.
	assert(mf->read_pos > mf->keep_size_before);
	const uint32_t move_offset
		= (mf->read_pos - mf->keep_size_before) & ~UINT32_C(15);

	assert(mf->write_pos > move_offset);
	const size_t move_size = mf->write_pos - move_offset;

	assert(move_offset + move_size <= mf->size);

	memmove(mf->buffer, mf->buffer + move_offset, move_size);

	mf->offset += move_offset;
	mf->read_pos -= move_offset;
	mf->read_limit -= move_offset;
	mf->write_pos -= move_offset;

	return;
}